

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffectShadow.cpp
# Opt level: O1

SharedPtr<FontEffect> __thiscall
Rml::FontEffectShadowInstancer::InstanceFontEffect
          (FontEffectShadowInstancer *this,String *param_1,PropertyDictionary *properties)

{
  Colourb _colour;
  FontEffectShadow *pFVar1;
  Property *pPVar2;
  PropertyDictionary *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SharedPtr<FontEffect> SVar3;
  SharedPtr<Rml::FontEffectShadow> font_effect;
  undefined1 local_49;
  undefined8 local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  ulong local_38;
  
  pPVar2 = PropertyDictionary::GetProperty(in_RCX,param_1[4].field_2._M_local_buf[0]);
  local_48 = (FontEffectShadow *)((ulong)local_48._4_4_ << 0x20);
  Variant::GetInto<int,_0>(&pPVar2->value,(int *)&local_48);
  local_38 = (ulong)local_48 & 0xffffffff;
  pPVar2 = PropertyDictionary::GetProperty(in_RCX,param_1[4].field_2._M_local_buf[1]);
  local_48 = (FontEffectShadow *)((ulong)local_48 & 0xffffffff00000000);
  Variant::GetInto<int,_0>(&pPVar2->value,(int *)&local_48);
  pFVar1 = local_48;
  pPVar2 = PropertyDictionary::GetProperty(in_RCX,param_1[4].field_2._M_local_buf[2]);
  local_48 = (FontEffectShadow *)CONCAT44(local_48._4_4_,0xff000000);
  Variant::GetInto<Rml::Colour<unsigned_char,_255,_false>,_0>
            (&pPVar2->value,(Colour<unsigned_char,_255,_false> *)&local_48);
  _colour = local_48._0_4_;
  local_48 = (FontEffectShadow *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Rml::FontEffectShadow,std::allocator<Rml::FontEffectShadow>>
            (&local_40,(FontEffectShadow **)&local_48,(allocator<Rml::FontEffectShadow> *)&local_49)
  ;
  *(ulong *)&(local_48->offset).x = ((long)pFVar1 << 0x20) + local_38;
  FontEffect::SetColour(&local_48->super_FontEffect,_colour);
  (this->super_FontEffectInstancer)._vptr_FontEffectInstancer = (_func_int **)local_48;
  (this->super_FontEffectInstancer).properties.properties.
  super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_FontEffectInstancer).properties.properties.
  super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_40._M_pi;
  SVar3.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar3.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SharedPtr<FontEffect>)
         SVar3.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<FontEffect> FontEffectShadowInstancer::InstanceFontEffect(const String& /*name*/, const PropertyDictionary& properties)
{
	Vector2i offset;
	offset.x = properties.GetProperty(id_offset_x)->Get<int>();
	offset.y = properties.GetProperty(id_offset_y)->Get<int>();
	Colourb color = properties.GetProperty(id_color)->Get<Colourb>();

	auto font_effect = MakeShared<FontEffectShadow>();
	if (font_effect->Initialise(offset))
	{
		font_effect->SetColour(color);
		return font_effect;
	}

	return nullptr;
}